

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_send(mg_connection *nc,void *buf,int len)

{
  char *path;
  double dVar1;
  
  dVar1 = cs_time();
  nc->last_io_time = (long)dVar1;
  if ((nc->flags & 2) == 0) {
    mbuf_append(&nc->send_mbuf,buf,(long)len);
  }
  else {
    mg_if_udp_send(nc,buf,(long)len);
  }
  if ((nc->mgr != (mg_mgr *)0x0) && (path = nc->mgr->hexdump_file, path != (char *)0x0)) {
    mg_hexdump_connection(nc,path,buf,len,4);
    return;
  }
  return;
}

Assistant:

void mg_send(struct mg_connection *nc, const void *buf, int len) {
    nc->last_io_time = mg_time();
    if (nc->flags & MG_F_UDP) {
        mg_if_udp_send(nc, buf, len);
    } else {
        mg_if_tcp_send(nc, buf, len);
    }
#if !defined(NO_LIBC) && !defined(MG_DISABLE_HEXDUMP)
    if (nc->mgr && nc->mgr->hexdump_file != NULL) {
        mg_hexdump_connection(nc, nc->mgr->hexdump_file, buf, len, MG_EV_SEND);
    }
#endif
}